

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::
     Serialization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::load(BinaryBuffer *bb,String *s)

{
  undefined7 uVar1;
  undefined1 *puVar2;
  ulong in_RSI;
  char c;
  size_t i;
  size_t sz;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  BinaryBuffer *in_stack_ffffffffffffffe0;
  BinaryBuffer *bb_00;
  BinaryBuffer *local_18;
  
  load<unsigned_long>(in_stack_ffffffffffffffe0,
                      (unsigned_long *)
                      CONCAT17(in_stack_ffffffffffffffdf,
                               CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)));
  std::__cxx11::string::resize(in_RSI);
  for (bb_00 = (BinaryBuffer *)0x0; bb_00 < local_18;
      bb_00 = (BinaryBuffer *)((long)&bb_00->_vptr_BinaryBuffer + 1)) {
    uVar1 = CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffde = in_stack_ffffffffffffffdf;
    load<char>(bb_00,(char *)CONCAT17(in_stack_ffffffffffffffdf,uVar1));
    in_stack_ffffffffffffffdf = in_stack_ffffffffffffffde;
    puVar2 = (undefined1 *)std::__cxx11::string::operator[](in_RSI);
    *puVar2 = in_stack_ffffffffffffffde;
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, String& s)
    {
      size_t sz;
      diy::load(bb, sz);
      s.resize(sz);
      for (size_t i = 0; i < sz; ++i)
      {
          char c;
          diy::load(bb, c);
          s[i] = c;
      }
    }